

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

TableGet * __thiscall
wasm::Builder::makeTableGet(Builder *this,Name table,Expression *index,Type type)

{
  TableGet *this_00;
  
  this_00 = MixedArena::alloc<wasm::TableGet>(&this->wasm->allocator);
  (this_00->table).super_IString.str._M_len = table.super_IString.str._M_len;
  (this_00->table).super_IString.str._M_str = table.super_IString.str._M_str;
  this_00->index = index;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)45>).super_Expression.type.id = type.id;
  TableGet::finalize(this_00);
  return this_00;
}

Assistant:

TableGet* makeTableGet(Name table, Expression* index, Type type) {
    auto* ret = wasm.allocator.alloc<TableGet>();
    ret->table = table;
    ret->index = index;
    ret->type = type;
    ret->finalize();
    return ret;
  }